

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O3

int __thiscall helics::Input::getValue(Input *this,char *str,int maxsize)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  int iVar3;
  
  pbVar2 = getValueRef<std::__cxx11::string>(this);
  iVar3 = 0;
  if (0 < maxsize && str != (char *)0x0) {
    iVar1 = (int)pbVar2->_M_string_length;
    iVar3 = maxsize;
    if (iVar1 < maxsize) {
      iVar3 = iVar1;
    }
    memcpy(str,(pbVar2->_M_dataplus)._M_p,(long)iVar3);
    if (iVar1 < maxsize) {
      str[iVar3] = '\0';
      iVar3 = iVar3 + 1;
    }
    else {
      str[(ulong)(uint)maxsize - 1] = '\0';
    }
  }
  this->hasUpdate = false;
  return iVar3;
}

Assistant:

int Input::getValue(char* str, int maxsize)
{
    const auto& S = getValueRef<std::string>();
    int length = 0;
    if (str != nullptr && maxsize > 0) {
        length = std::min(static_cast<int>(S.size()), maxsize);
        memcpy(str, S.data(), length);
        if (length == maxsize) {
            str[maxsize - 1] = '\0';
        } else {
            str[length] = '\0';
            ++length;
        }
    }
    hasUpdate = false;
    return length;
}